

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

bool Omega_h::operator==(Read<int> *a,Read<int> *b)

{
  bool bVar1;
  undefined1 local_c8 [8];
  type transform;
  logical_and<bool> op;
  bool init;
  IntIterator last;
  IntIterator first;
  Read<int> *b_local;
  Read<int> *a_local;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_10 >> 2) == (int)(local_20 >> 2)) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    transform.b.write_.shared_alloc_.direct_ptr._7_1_ = 1;
    transform.b.write_.shared_alloc_.direct_ptr._6_1_ = 0;
    Read<int>::Read((Read<int> *)local_c8,a);
    Read<int>::Read((Read<int> *)&transform.a.write_.shared_alloc_.direct_ptr,b);
    bVar1 = operator==(0,(int)(local_30 >> 2),1,local_c8);
    operator==<int>(Omega_h::Read<int>,Omega_h::Read<int>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_c8);
    return bVar1;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xd);
}

Assistant:

bool operator==(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto const first = IntIterator(0);
  auto const last = IntIterator(a.size());
  auto const init = true;
  auto const op = logical_and<bool>();
  auto transform = OMEGA_H_LAMBDA(LO i)->bool { return a[i] == b[i]; };
  return transform_reduce(first, last, init, op, std::move(transform));
}